

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::AnimationCurveNode::AnimationCurveNode
          (AnimationCurveNode *this,uint64_t id,Element *element,string *name,Document *doc,
          char **target_prop_whitelist,size_t whitelist_size)

{
  bool bVar1;
  int iVar2;
  Scope *sc_00;
  uint64_t source;
  reference ppCVar3;
  long lVar4;
  range_error *this_00;
  string *psVar5;
  allocator<char> local_149;
  string local_148;
  shared_ptr<const_Assimp::FBX::PropertyTable> local_128;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  Object *local_c8;
  Object *ob;
  size_t i;
  char *pcStack_b0;
  bool ok;
  char *s;
  Connection *con;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *__range2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *local_70;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *conns;
  char *whitelist [3];
  Scope *sc;
  char **target_prop_whitelist_local;
  Document *doc_local;
  string *name_local;
  Element *element_local;
  uint64_t id_local;
  AnimationCurveNode *this_local;
  
  FBX::Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__AnimationCurveNode_00faf2e0;
  this->target = (Object *)0x0;
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::shared_ptr(&this->props);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
  ::map(&this->curves);
  std::__cxx11::string::string((string *)&this->prop);
  this->doc = doc;
  sc_00 = GetRequiredScope(element);
  whitelist[1] = "Deformer";
  conns = (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           *)0xb854e3;
  whitelist[0] = "NodeAttribute";
  source = FBX::Object::ID(&this->super_Object);
  Document::GetConnectionsBySourceSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&__range2,doc,source,(char **)&conns,3);
  local_70 = (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&__range2;
  __end2 = std::
           vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           ::begin((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    *)&__range2);
  con = (Connection *)
        std::
        vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
        end((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
             *)&__range2);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                                *)&con);
    if (!bVar1) {
LAB_009f8c2a:
      if (this->target == (Object *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,
                   "failed to resolve target Model/NodeAttribute/Constraint for AnimationCurveNode",
                   &local_111);
        Util::DOMWarning(&local_110,element);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator(&local_111);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"AnimationCurveNode.FbxAnimCurveNode",&local_149);
      Util::GetPropertyTable((Util *)&local_128,doc,&local_148,element,sc_00,false);
      std::shared_ptr<const_Assimp::FBX::PropertyTable>::operator=(&this->props,&local_128);
      std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr(&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
      std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ::~vector((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                 *)&__range2);
      return;
    }
    ppCVar3 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
              ::operator*(&__end2);
    s = (char *)*ppCVar3;
    Connection::PropertyName_abi_cxx11_((Connection *)s);
    lVar4 = std::__cxx11::string::length();
    if (lVar4 != 0) {
      if (target_prop_whitelist != (char **)0x0) {
        Connection::PropertyName_abi_cxx11_((Connection *)s);
        pcStack_b0 = (char *)std::__cxx11::string::c_str();
        i._7_1_ = 0;
        for (ob = (Object *)0x0; ob < whitelist_size; ob = (Object *)((long)&ob->_vptr_Object + 1))
        {
          iVar2 = strcmp(pcStack_b0,target_prop_whitelist[(long)ob]);
          if (iVar2 == 0) {
            i._7_1_ = 1;
            break;
          }
        }
        if ((i._7_1_ & 1) == 0) {
          this_00 = (range_error *)__cxa_allocate_exception(0x10);
          std::range_error::range_error
                    (this_00,"AnimationCurveNode target property is not in whitelist");
          __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
        }
      }
      local_c8 = Connection::DestinationObject((Connection *)s);
      if (local_c8 == (Object *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,
                   "failed to read destination object for AnimationCurveNode->Model link, ignoring",
                   &local_e9);
        Util::DOMWarning(&local_e8,element);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator(&local_e9);
      }
      else {
        this->target = local_c8;
        if (this->target != (Object *)0x0) {
          psVar5 = Connection::PropertyName_abi_cxx11_((Connection *)s);
          std::__cxx11::string::operator=((string *)&this->prop,(string *)psVar5);
          goto LAB_009f8c2a;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

AnimationCurveNode::AnimationCurveNode(uint64_t id, const Element& element, const std::string& name, 
        const Document& doc, const char* const * target_prop_whitelist /*= NULL*/, 
        size_t whitelist_size /*= 0*/)
: Object(id, element, name)
, target()
, doc(doc)
{
    const Scope& sc = GetRequiredScope(element);

    // find target node
    const char* whitelist[] = {"Model","NodeAttribute","Deformer"};
    const std::vector<const Connection*>& conns = doc.GetConnectionsBySourceSequenced(ID(),whitelist,3);

    for(const Connection* con : conns) {

        // link should go for a property
        if (!con->PropertyName().length()) {
            continue;
        }

        if(target_prop_whitelist) {
            const char* const s = con->PropertyName().c_str();
            bool ok = false;
            for (size_t i = 0; i < whitelist_size; ++i) {
                if (!strcmp(s, target_prop_whitelist[i])) {
                    ok = true;
                    break;
                }
            }

            if (!ok) {
                throw std::range_error("AnimationCurveNode target property is not in whitelist");
            }
        }

        const Object* const ob = con->DestinationObject();
        if(!ob) {
            DOMWarning("failed to read destination object for AnimationCurveNode->Model link, ignoring",&element);
            continue;
        }

        // XXX support constraints as DOM class
        //ai_assert(dynamic_cast<const Model*>(ob) || dynamic_cast<const NodeAttribute*>(ob));
        target = ob;
        if(!target) {
            continue;
        }

        prop = con->PropertyName();
        break;
    }

    if(!target) {
        DOMWarning("failed to resolve target Model/NodeAttribute/Constraint for AnimationCurveNode",&element);
    }

    props = GetPropertyTable(doc,"AnimationCurveNode.FbxAnimCurveNode",element,sc,false);
}